

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
CheckAndStoreTopologySplitEvent
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int src_symbol_id,int param_2,EdgeFaceName src_edge,int neighbor_face_id)

{
  pointer *ppTVar1;
  iterator __position;
  const_iterator cVar2;
  TopologySplitEventData event_data;
  TopologySplitEventData local_24;
  
  local_24.split_symbol_id = neighbor_face_id;
  cVar2 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->face_to_split_symbol_map_)._M_h,(key_type *)&local_24);
  if ((cVar2.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
       (__node_type *)0x0) &&
     (local_24.split_symbol_id =
           *(uint32_t *)
            ((long)cVar2.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur + 0xc),
     local_24.split_symbol_id != 0xffffffff)) {
    local_24._8_4_ = CONCAT31(local_24._9_3_,src_edge) & 0xffffff01;
    __position._M_current =
         (this->topology_split_event_data_).
         super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->topology_split_event_data_).
        super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_24.source_symbol_id = src_symbol_id;
      std::vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>::
      _M_realloc_insert<draco::TopologySplitEventData_const&>
                ((vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>
                  *)&this->topology_split_event_data_,__position,&local_24);
    }
    else {
      *(undefined4 *)&(__position._M_current)->field_0x8 = local_24._8_4_;
      (__position._M_current)->split_symbol_id = local_24.split_symbol_id;
      (__position._M_current)->source_symbol_id = src_symbol_id;
      ppTVar1 = &(this->topology_split_event_data_).
                 super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::CheckAndStoreTopologySplitEvent(int src_symbol_id,
                                                       int /* src_face_id */,
                                                       EdgeFaceName src_edge,
                                                       int neighbor_face_id) {
  const int symbol_id = GetSplitSymbolIdOnFace(neighbor_face_id);
  if (symbol_id == -1) {
    return;  // Not a split symbol, no topology split event could happen.
  }
  TopologySplitEventData event_data;

  event_data.split_symbol_id = symbol_id;
  event_data.source_symbol_id = src_symbol_id;
  event_data.source_edge = src_edge;
  topology_split_event_data_.push_back(event_data);
}